

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void print_expr_struct_debug(lyxp_expr *exp)

{
  lyxp_expr_type *plVar1;
  char *pcVar2;
  size_t sVar3;
  lyxp_expr_type lVar4;
  ushort uVar5;
  ulong uVar6;
  char local_b8 [8];
  char tmp [128];
  
  if (2 < ly_log_level) {
    ly_log_dbg(8,"expression \"%s\":",exp->expr);
    if (exp->used != 0) {
      uVar6 = 0;
      do {
        pcVar2 = print_token(exp->tokens[uVar6]);
        sprintf(local_b8,"\ttoken %s, in expression \"%.*s\"",pcVar2,(ulong)exp->tok_len[uVar6],
                exp->expr + exp->expr_pos[uVar6]);
        plVar1 = exp->repeat[uVar6];
        if (plVar1 != (lyxp_expr_type *)0x0) {
          sVar3 = strlen(local_b8);
          sprintf(local_b8 + sVar3," (repeat %d",(ulong)*plVar1);
          lVar4 = exp->repeat[uVar6][1];
          tmp._120_8_ = uVar6;
          if (lVar4 != LYXP_EXPR_NONE) {
            uVar5 = 2;
            do {
              sVar3 = strlen(local_b8);
              sprintf(local_b8 + sVar3,", %d",(ulong)lVar4);
              lVar4 = exp->repeat[tmp._120_8_][uVar5];
              uVar5 = uVar5 + 1;
            } while (lVar4 != LYXP_EXPR_NONE);
          }
          sVar3 = strlen(local_b8);
          (local_b8 + sVar3)[0] = ')';
          (local_b8 + sVar3)[1] = '\0';
          uVar6 = tmp._120_8_;
        }
        ly_log_dbg(8,local_b8);
        uVar6 = uVar6 + 1;
      } while (uVar6 < exp->used);
    }
  }
  return;
}

Assistant:

static void
print_expr_struct_debug(struct lyxp_expr *exp)
{
    uint16_t i, j;
    char tmp[128];

    if (!exp || (ly_log_level < LY_LLDBG)) {
        return;
    }

    LOGDBG(LY_LDGXPATH, "expression \"%s\":", exp->expr);
    for (i = 0; i < exp->used; ++i) {
        sprintf(tmp, "\ttoken %s, in expression \"%.*s\"", print_token(exp->tokens[i]), exp->tok_len[i],
               &exp->expr[exp->expr_pos[i]]);
        if (exp->repeat[i]) {
            sprintf(tmp + strlen(tmp), " (repeat %d", exp->repeat[i][0]);
            for (j = 1; exp->repeat[i][j]; ++j) {
                sprintf(tmp + strlen(tmp), ", %d", exp->repeat[i][j]);
            }
            strcat(tmp, ")");
        }
        LOGDBG(LY_LDGXPATH, tmp);
    }
}